

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

int read_mtree(archive_read *a,mtree *mtree)

{
  int iVar1;
  bool bVar2;
  int local_50;
  int local_4c;
  int is_form_d;
  int r;
  mtree_entry *last_entry;
  mtree_option *global;
  char *p;
  uintmax_t counter;
  ssize_t len;
  mtree *mtree_local;
  archive_read *a_local;
  
  mtree->archive_format = 0x80000;
  mtree->archive_format_name = "mtree";
  last_entry = (mtree_entry *)0x0;
  _is_form_d = (mtree_entry *)0x0;
  len = (ssize_t)mtree;
  mtree_local = (mtree *)a;
  detect_form(a,&local_50);
  p = (char *)0x1;
  do {
    counter = readline((archive_read *)mtree_local,(mtree *)len,(char **)&global,0x10000);
    if (counter == 0) {
      *(undefined8 *)(len + 0x48) = *(undefined8 *)(len + 0x40);
      free_options((mtree_option *)last_entry);
      return 0;
    }
    if ((long)counter < 0) {
      free_options((mtree_option *)last_entry);
      return (int)counter;
    }
    while( true ) {
      bVar2 = true;
      if (*(char *)&global->next != ' ') {
        bVar2 = *(char *)&global->next == '\t';
      }
      if (!bVar2) break;
      global = (mtree_option *)((long)&global->next + 1);
      counter = counter - 1;
    }
    if ((((*(char *)&global->next != '#') && (*(char *)&global->next != '\r')) &&
        (*(char *)&global->next != '\n')) && (*(char *)&global->next != '\0')) {
      if (*(char *)&global->next == '/') {
        if (((long)counter < 5) || (iVar1 = strncmp((char *)global,"/set",4), iVar1 != 0)) {
          if ((((long)counter < 7) || (iVar1 = strncmp((char *)global,"/unset",6), iVar1 != 0)) ||
             ((*(char *)((long)&global->next + 6) != ' ' &&
              (*(char *)((long)&global->next + 6) != '\t')))) goto LAB_00696d41;
          local_4c = process_global_unset
                               ((archive_read *)mtree_local,(mtree_option **)&last_entry,
                                (char *)global);
        }
        else {
          if ((*(char *)((long)&global->next + 4) != ' ') &&
             (*(char *)((long)&global->next + 4) != '\t')) {
LAB_00696d41:
            archive_set_error((archive *)mtree_local,0x54,"Can\'t parse line %ju",p);
            free_options((mtree_option *)last_entry);
            return -0x1e;
          }
          local_4c = process_global_set((archive_read *)mtree_local,(mtree_option **)&last_entry,
                                        (char *)global);
        }
      }
      else {
        local_4c = process_add_entry((archive_read *)mtree_local,(mtree *)len,
                                     (mtree_option **)&last_entry,(char *)global,counter,
                                     (mtree_entry **)&is_form_d,local_50);
      }
      if (local_4c != 0) {
        free_options((mtree_option *)last_entry);
        return local_4c;
      }
    }
    p = p + 1;
  } while( true );
}

Assistant:

static int
read_mtree(struct archive_read *a, struct mtree *mtree)
{
	ssize_t len;
	uintmax_t counter;
	char *p;
	struct mtree_option *global;
	struct mtree_entry *last_entry;
	int r, is_form_d;

	mtree->archive_format = ARCHIVE_FORMAT_MTREE;
	mtree->archive_format_name = "mtree";

	global = NULL;
	last_entry = NULL;

	(void)detect_form(a, &is_form_d);

	for (counter = 1; ; ++counter) {
		len = readline(a, mtree, &p, 65536);
		if (len == 0) {
			mtree->this_entry = mtree->entries;
			free_options(global);
			return (ARCHIVE_OK);
		}
		if (len < 0) {
			free_options(global);
			return ((int)len);
		}
		/* Leading whitespace is never significant, ignore it. */
		while (*p == ' ' || *p == '\t') {
			++p;
			--len;
		}
		/* Skip content lines and blank lines. */
		if (*p == '#')
			continue;
		if (*p == '\r' || *p == '\n' || *p == '\0')
			continue;
		if (*p != '/') {
			r = process_add_entry(a, mtree, &global, p, len,
			    &last_entry, is_form_d);
		} else if (len > 4 && strncmp(p, "/set", 4) == 0) {
			if (p[4] != ' ' && p[4] != '\t')
				break;
			r = process_global_set(a, &global, p);
		} else if (len > 6 && strncmp(p, "/unset", 6) == 0) {
			if (p[6] != ' ' && p[6] != '\t')
				break;
			r = process_global_unset(a, &global, p);
		} else
			break;

		if (r != ARCHIVE_OK) {
			free_options(global);
			return r;
		}
	}

	archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
	    "Can't parse line %ju", counter);
	free_options(global);
	return (ARCHIVE_FATAL);
}